

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

Id __thiscall spv::Builder::getDerefTypeId(Builder *this,Id resultId)

{
  uint uVar1;
  pointer ppIVar2;
  
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = ppIVar2[resultId]->typeId;
  if (ppIVar2[uVar1]->opCode == OpTypePointer) {
    return *(Id *)(*(long *)&((this->module).idToInstruction.
                              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar1]->operands).
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data + 4);
  }
  __assert_fail("isPointerType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x245,"Id spv::Builder::getDerefTypeId(Id) const");
}

Assistant:

spv::Id getTypeId(Id resultId) const { return idToInstruction[resultId]->getTypeId(); }